

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreSimplify.cpp
# Opt level: O2

void mathCore::equiv_standarizer(expression *a)

{
  expSet *this;
  _Rb_tree_header *p_Var1;
  const_iterator __position;
  bool bVar2;
  int iVar3;
  int iVar4;
  iterator __position_00;
  iterator __position_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  expression *peVar5;
  expression *peVar6;
  iterator iVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  expression *first;
  expSet tempStore;
  expression *local_88;
  expression *local_80;
  expression *local_78;
  expression *local_70;
  expression *local_68;
  _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
  local_60;
  
  bVar2 = is_equiv(a);
  if (bVar2) {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    this = &a->contents;
    p_Var1 = &(a->contents)._M_t._M_impl.super__Rb_tree_header;
    local_78 = a;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    while (peVar5 = local_78,
          2 < (local_78->contents)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      std::
      _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
      ::clear(&local_60);
      iVar7._M_node = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      __position_01._M_node =
           (peVar5->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while ((_Rb_tree_header *)__position_01._M_node != p_Var1) {
        local_88 = *(expression **)(__position_01._M_node + 1);
        __position_00 =
             std::
             _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
             ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                 *)this,__position_01._M_node);
        if ((_Rb_tree_header *)__position_00._M_node == p_Var1) {
          std::
          _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
          ::_M_insert_equal_<expression*const&>
                    ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                      *)&local_60,(const_iterator)iVar7._M_node,&local_88);
          __position_01 = __position_00;
        }
        else {
          peVar5 = *(expression **)(__position_00._M_node + 1);
          __position_01 =
               std::
               _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
               ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                   *)this,__position_00._M_node);
          iVar3 = copy((EVP_PKEY_CTX *)local_88,(EVP_PKEY_CTX *)__position_00._M_node);
          local_68 = (expression *)CONCAT44(extraout_var,iVar3);
          iVar3 = copy((EVP_PKEY_CTX *)peVar5,(EVP_PKEY_CTX *)__position_00._M_node);
          local_70 = (expression *)CONCAT44(extraout_var_00,iVar3);
          negate(local_88);
          negate(peVar5);
          peVar5 = binary_and(local_88,peVar5);
          peVar6 = binary_and(local_68,local_70);
          local_80 = binary_or(peVar5,peVar6);
          iVar7 = std::
                  _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                  ::_M_insert_equal_<expression*>
                            ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                              *)&local_60,iVar7._M_node,&local_80);
        }
      }
      mergeMultiSet(this,(expSet *)&local_60);
    }
    __position._M_node = (local_78->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_88 = *(expression **)(__position._M_node + 1);
    iVar7 = std::
            _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
            ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                *)this,__position);
    peVar6 = *(expression **)(iVar7._M_node + 1);
    std::
    _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
    ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                        *)this,(const_iterator)iVar7._M_node);
    iVar3 = copy((EVP_PKEY_CTX *)local_88,(EVP_PKEY_CTX *)iVar7._M_node);
    iVar4 = copy((EVP_PKEY_CTX *)peVar6,(EVP_PKEY_CTX *)iVar7._M_node);
    negate(local_88);
    negate(peVar6);
    local_80 = binary_and(local_88,peVar6);
    std::
    _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
    ::_M_insert_equal<expression*>
              ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                *)this,&local_80);
    local_80 = binary_and((expression *)CONCAT44(extraout_var_01,iVar3),
                          (expression *)CONCAT44(extraout_var_02,iVar4));
    std::
    _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
    ::_M_insert_equal<expression*>
              ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                *)this,&local_80);
    trans_or(peVar5);
    std::
    _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

void mathCore::equiv_standarizer(expression* a) {
	if (mathCore::is_equiv(a)) {
		// Just by the number of variables you can grasp how much more complicated this is!
		expSet tempStore;
		expSet::iterator iter, hintOther;
		expression *first, *second, *firstNew, *secondNew;

		// Keep going until there are at most two things in the tree!
		while (a->contents.size() > 2) {
			// Clear the tempStore, Start at the beginning!
			tempStore.clear();
			iter = a->contents.begin();
			hintOther = tempStore.begin();	// Hints to make this crazy slow thing faster!

											// This runs until we are at the end of the expression!
			while (iter != a->contents.end()) {

				first = *iter;
				iter = a->contents.erase(iter); // Remove it from contents, go forward!
				if (iter == a->contents.end()) { // If we have no other pair just insert first into the tempStore and continue!
					tempStore.insert(hintOther, first);
				}
				else {
					second = *iter;		// Pair of first!
					iter = a->contents.erase(iter);	// Keep moving forward!

													// Construct ~a*~b + a*b !
					firstNew = mathCore::copy(first);
					secondNew = mathCore::copy(second);
					mathCore::negate(first);
					mathCore::negate(second);

					// Hints keep this faster!
					hintOther = tempStore.insert(hintOther,
						// AND OR of AND's!
						mathCore::binary_or(binary_and(first, second), binary_and(firstNew, secondNew)));
				}

			}
			// Now Merge tempStore into a, and continue all over again!
			mergeMultiSet(a->contents, tempStore);
		}

		// Now the EQUIV has exactly 2 elements!
		iter = a->contents.begin();
		first = *iter;
		iter = a->contents.erase(iter);
		second = *iter;
		iter = a->contents.erase(iter);
		// Remove them and construct the new things which go into the EQUIV!

		firstNew = mathCore::copy(first);
		secondNew = mathCore::copy(second);
		mathCore::negate(first);
		mathCore::negate(second);

		// Finally insert these last two into the EQUIV!
		a->contents.insert(binary_and(first, second));
		a->contents.insert(binary_and(firstNew, secondNew));

		// Now we are an OR expression!
		mathCore::trans_or(a);
	}
}